

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

void nite::strSplit(string *input,string *split,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *list)

{
  pointer pcVar1;
  int iVar2;
  ulong uVar3;
  string local_70;
  string local_50;
  
  if ((list->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (list->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(list);
  }
  pcVar1 = (input->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + input->_M_string_length);
  strRemoveCoin(&local_50,&local_70,split);
  std::__cxx11::string::operator=((string *)input,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  iVar2 = std::__cxx11::string::find((char *)input,(ulong)(split->_M_dataplus)._M_p,0);
  do {
    if (iVar2 == -1) {
      if (input->_M_string_length != 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(list,input);
      }
      return;
    }
    if ((int)input->_M_string_length + -1 == iVar2) {
      uVar3 = input->_M_string_length - 1;
LAB_0018c2cb:
      std::__cxx11::string::erase((ulong)input,uVar3);
    }
    else {
      if (iVar2 == 0) {
        uVar3 = 0;
        goto LAB_0018c2cb;
      }
      subStr(&local_50,input,0,iVar2 - 1);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)list,&local_50
                );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      subStr(&local_50,input,iVar2 + (int)split->_M_string_length,(int)input->_M_string_length - 1);
      std::__cxx11::string::operator=((string *)input,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
    iVar2 = std::__cxx11::string::find((char *)input,(ulong)(split->_M_dataplus)._M_p,0);
  } while( true );
}

Assistant:

void nite::strSplit(String input, const String &split, Vector<String> &list){
	if ( !list.size() ){
		list.clear();
	}

	input = nite::strRemoveCoin(input, split);

	while (1){
		int k = input.find(split);

		if (k == -1){
			if (input.length()>0){
				list.push_back(input);
			}
			break;
		}

		if (k == (int)input.length()-1){
			input.erase(input.length()-1, split.length());
			continue;
		}

		if (k == 0){
			input.erase(0, split.length());
			continue;
		}

		list.push_back(subStr(input, 0,k-1));
		input = nite::subStr(input, k+split.length(), input.length()-1);
	}

	return;
}